

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O2

void __thiscall bsim::dynamic_bit_vector::dynamic_bit_vector(dynamic_bit_vector *this,int N_)

{
  byte *pbVar1;
  pointer puVar2;
  int i;
  uint uVar3;
  
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->N = N_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->bits,(long)(int)((N_ / 8 - (uint)((N_ & 7U) == 0)) + 1));
  uVar3 = 0;
  while( true ) {
    puVar2 = (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <= (ulong)uVar3)
    break;
    puVar2[uVar3] = '\0';
    uVar3 = uVar3 + 1;
  }
  for (uVar3 = 0; (int)uVar3 < this->N; uVar3 = uVar3 + 1) {
    pbVar1 = (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + (uVar3 >> 3);
    *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)uVar3 & 7));
  }
  return;
}

Assistant:

dynamic_bit_vector(const int N_) : N(N_) {
      bits.resize(NUM_BYTES(N));
      for (uint i = 0; i < bits.size(); i++) {
	bits[i] = 0;
      }
      
      for (int i = 0; i < N; i++) {
	set(i, 0);
      }
    }